

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void slang::SourceManager::computeLineOffsets
               (SmallVector<char,_40UL> *buffer,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  unsigned_long local_30;
  
  local_30 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (offsets,&local_30);
  pcVar3 = (buffer->super_SmallVectorBase<char>).data_;
  pcVar4 = pcVar3 + (buffer->super_SmallVectorBase<char>).len;
  while (pcVar3 != pcVar4) {
    cVar1 = *pcVar3;
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
      cVar2 = pcVar3[1];
      if (((cVar2 == '\r') || (cVar2 == '\n')) && (cVar1 != cVar2)) {
        pcVar3 = pcVar3 + 1;
      }
      pcVar3 = pcVar3 + 1;
      local_30 = (long)pcVar3 - (long)(buffer->super_SmallVectorBase<char>).data_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (offsets,&local_30);
    }
    else {
      pcVar3 = pcVar3 + 1;
    }
  }
  return;
}

Assistant:

void SourceManager::computeLineOffsets(const SmallVector<char>& buffer,
                                       std::vector<size_t>& offsets) noexcept {
    // first line always starts at offset 0
    offsets.push_back(0);

    const char* ptr = buffer.data();
    const char* end = buffer.data() + buffer.size();
    while (ptr != end) {
        if (ptr[0] == '\n' || ptr[0] == '\r') {
            // if we see \r\n or \n\r skip both chars
            if ((ptr[1] == '\n' || ptr[1] == '\r') && ptr[0] != ptr[1])
                ptr++;
            ptr++;
            offsets.push_back((size_t)(ptr - buffer.data()));
        }
        else {
            ptr++;
        }
    }
}